

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  cartesian_cubic<float> *pcVar1;
  double *pdVar2;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pCVar3;
  double *pdVar4;
  undefined8 *puVar5;
  void *__buf;
  vector extent;
  vector origin;
  vector scale;
  si_function<sisl::cartesian_cubic<float>,_sisl::tp_linear,_3> bucky;
  isosurface mc;
  undefined1 local_4368 [24];
  long local_4350;
  DenseStorage<double,__1,__1,_1,_0> local_4348;
  Scalar local_4330;
  DenseStorage<double,__1,__1,_1,_0> local_4328;
  DenseStorage<double,__1,__1,_1,_0> local_4318;
  DenseStorage<double,__1,__1,_1,_0> local_4300;
  DenseStorage<double,__1,__1,_1,_0> local_42f0;
  Scalar local_42e0;
  si_function<sisl::cartesian_cubic<float>,_sisl::tp_linear,_3> local_42d8;
  isosurface local_4278;
  
  local_4278.m_shadingSs = 0.0001;
  local_4278.plyfile.m_currentIndex = 0;
  local_4278.plyfile.m_mergeTolerance = 1e-12;
  local_4278.plyfile.verts.super__Vector_base<sisl::vertex3,_std::allocator<sisl::vertex3>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_4278.plyfile.verts.super__Vector_base<sisl::vertex3,_std::allocator<sisl::vertex3>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4278.plyfile.verts.super__Vector_base<sisl::vertex3,_std::allocator<sisl::vertex3>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4278.plyfile.faces.
  super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_4278.plyfile.faces.
  super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4278.plyfile.faces.
  super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4278.faces.
  super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_4278.faces.
  super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4278.faces.
  super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  memcpy(local_4278.edges,&DAT_001154f0,0x200);
  memcpy(local_4278.triangles,&DAT_001156f0,0x4000);
  local_4368._0_4_ = 0x20;
  local_4318.m_data = (double *)CONCAT44(local_4318.m_data._4_4_,0x20);
  local_4328.m_data = (double *)CONCAT44(local_4328.m_data._4_4_,0x20);
  local_42d8.super_function._vptr_function = (_func_int **)local_42d8._d;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_42d8,"data/Bucky.raw","");
  local_4348.m_data = (double *)((ulong)local_4348.m_data._4_4_ << 0x20);
  local_4330 = (Scalar)((ulong)local_4330 & 0xffffffffffffff00);
  pcVar1 = sisl::io::read_raw_file<float>
                     ((int *)local_4368,(int *)&local_4318,(int *)&local_4328,(string *)&local_42d8,
                      (e_datatype *)&local_4348,(bool *)&local_4330);
  if ((cartesian_cubic<float> **)local_42d8.super_function._vptr_function != local_42d8._d) {
    operator_delete(local_42d8.super_function._vptr_function);
  }
  sisl::si_function<sisl::cartesian_cubic<float>,_sisl::tp_linear,_3>::si_function(&local_42d8);
  local_4318.m_data = (double *)0x0;
  local_4318.m_rows = 0;
  local_42d8._lattice = pcVar1;
  pdVar2 = (double *)malloc(0x18);
  if (((ulong)pdVar2 & 0xf) == 0) {
    if (pdVar2 == (double *)0x0) {
      puVar5 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar5 = std::ios::widen;
      __cxa_throw(puVar5,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    local_4318.m_rows = 3;
    local_4368._8_8_ = 0;
    local_4368._16_8_ = 1;
    local_4350 = 1;
    *pdVar2 = 31.0;
    local_4328.m_data = (double *)0x403f000000000000;
    local_4368._0_8_ = &local_4318;
    local_4318.m_data = pdVar2;
    pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                       ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_4368,
                        (Scalar *)&local_4328);
    local_4348.m_data = (double *)0x403f000000000000;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
              (pCVar3,(Scalar *)&local_4348);
    if ((local_4350 + local_4368._8_8_ != *(Index *)(local_4368._0_8_ + 8)) ||
       (local_4368._16_8_ != 1)) {
LAB_0010793d:
      __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                    ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                    "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, -1, 1>>::finished() [MatrixType = Eigen::Matrix<double, -1, 1>]"
                   );
    }
    sisl::si_function<sisl::cartesian_cubic<float>,_sisl::tp_linear,_3>::set_scale
              (&local_42d8,(vector *)&local_4318);
    local_4328.m_data = (double *)0x0;
    local_4328.m_rows = 0;
    pdVar2 = (double *)malloc(0x18);
    if (((ulong)pdVar2 & 0xf) == 0) {
      if (pdVar2 == (double *)0x0) {
        puVar5 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar5 = std::ios::widen;
        __cxa_throw(puVar5,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      local_4328.m_rows = 3;
      local_4348.m_data = (double *)0x0;
      local_4348.m_rows = 0;
      local_4328.m_data = pdVar2;
      pdVar4 = (double *)malloc(0x18);
      if (((ulong)pdVar4 & 0xf) == 0) {
        if (pdVar4 == (double *)0x0) {
          puVar5 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar5 = std::ios::widen;
          __cxa_throw(puVar5,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
        }
        local_4348.m_rows = 3;
        local_4368._8_8_ = 0;
        local_4368._16_8_ = 1;
        local_4350 = 1;
        *pdVar2 = 0.0;
        local_4330 = 0.0;
        local_4368._0_8_ = &local_4328;
        local_4348.m_data = pdVar4;
        pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                           ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_4368,
                            &local_4330);
        local_42e0 = 0.0;
        Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                  (pCVar3,&local_42e0);
        if ((local_4350 + local_4368._8_8_ == *(Index *)(local_4368._0_8_ + 8)) &&
           (local_4368._16_8_ == 1)) {
          local_4368._8_8_ = 0;
          local_4368._16_8_ = 1;
          local_4350 = 1;
          local_4368._0_8_ = &local_4348;
          if (local_4348.m_rows < 1) {
            __assert_fail("m_xpr.rows() > 0 && m_xpr.cols() > 0 && \"Cannot comma-initialize a 0x0 matrix (operator<<)\""
                          ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x25,
                          "Eigen::CommaInitializer<Eigen::Matrix<double, -1, 1>>::CommaInitializer(XprType &, const Scalar &) [MatrixType = Eigen::Matrix<double, -1, 1>]"
                         );
          }
          *local_4348.m_data = 1.0;
          local_4330 = 1.0;
          pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                             ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                              local_4368,&local_4330);
          local_42e0 = 1.0;
          Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                    (pCVar3,&local_42e0);
          if ((local_4350 + local_4368._8_8_ == *(Index *)(local_4368._0_8_ + 8)) &&
             (local_4368._16_8_ == 1)) {
            local_4368._0_8_ = (Matrix<double,__1,_1,_0,__1,_1> *)0x405fc00000000000;
            local_4330 = 0.05;
            Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage(&local_42f0,&local_4328);
            Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage(&local_4300,&local_4348);
            pdVar2 = &local_4330;
            sisl::utility::isosurface::march_function
                      (&local_4278,&local_42d8.super_function,(double *)local_4368,pdVar2,
                       (vector *)&local_42f0,(vector *)&local_4300,true,(function *)0x0,
                       (function *)0x0,(function *)0x0);
            free(local_4300.m_data);
            free(local_42f0.m_data);
            local_4368._0_8_ = (Matrix<double,__1,_1,_0,__1,_1> *)(local_4368 + 0x10);
            std::__cxx11::string::_M_construct<char_const*>((string *)local_4368,"bucky.ply","");
            sisl::utility::ply_mesh::write(&local_4278.plyfile,(int)local_4368,__buf,(size_t)pdVar2)
            ;
            if ((Matrix<double,__1,_1,_0,__1,_1> *)local_4368._0_8_ !=
                (Matrix<double,__1,_1,_0,__1,_1> *)(local_4368 + 0x10)) {
              operator_delete((void *)local_4368._0_8_);
            }
            free(local_4348.m_data);
            free(local_4328.m_data);
            free(local_4318.m_data);
            local_42d8.super_function._vptr_function = (_func_int **)&PTR__si_function_0011dd08;
            free(local_42d8.m_vUserScale.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
            free(local_42d8._mSpaceTransform.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
            sisl::utility::isosurface::~isosurface(&local_4278);
            return 0;
          }
        }
        goto LAB_0010793d;
      }
    }
  }
  __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                "void *Eigen::internal::aligned_malloc(std::size_t)");
}

Assistant:

int main(int argc, char const *argv[])
{

	sisl::utility::isosurface mc;

    // This reads the data into memory, we specify float here,
    // which means that the lattice will hold floating values
    // but we could choose other, more compact data types
    cartesian_cubic<float> *cc = sisl::io::read_raw_file<float>(
                32, 32, 32, "data/Bucky.raw", SDT_UINT8);

    
    // Next, combine this data with a basis function in a si_function
    si_function<
        cartesian_cubic<float>, // specify the lattice (and its data type)
        tp_linear,              // specify the basis function
        3> bucky(cc);           // specify the dimension, and call this si_function bucky (fed with the cc lattice)
   
    // by default, an si_fuction has no scaling set, it'll exend to the maximum 
    // boundary of the lattice, 32 x 32 x 32 in this case
    vector scale(3);
    // Scaling is in the form f(s*x, s*y, s*z), so we specify 32-1,32-1,32-1 as scale
    scale << 31.,31.,31.;
    bucky.set_scale(scale);


    // Now we can just use the marching cubes algorithm to march over the data
    vector origin(3), extent(3);

    // Setup the volume over which MC will run
    origin << 0,0,0;
    extent << 1,1,1;

    mc.march_function(
            &bucky,
            127.0,
            0.05,
            origin,
            extent,
            true
    );

    // Write the output as a ply file
    mc.write_surface("bucky.ply");
}